

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_api_tests.cpp
# Opt level: O2

void decode_and_encode_c1_minimalExample_producesSameResult(void)

{
  __type _Var1;
  string bstr1;
  DecodedResult decodedResult;
  string expectedHrp;
  string bstr2;
  string sStack_a8;
  DecodedResult local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_a8,"a12uel5l",(allocator<char> *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"a",(allocator<char> *)&local_88);
  bech32::decode(&local_88,&sStack_a8);
  _Var1 = std::operator==(&local_48,&local_88.hrp);
  if (!_Var1) {
    __assert_fail("expectedHrp == decodedResult.hrp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                  ,0xd2,"void decode_and_encode_c1_minimalExample_producesSameResult()");
  }
  if (local_88.encoding == Bech32) {
    bech32::encodeUsingOriginalConstant(&local_28,&local_88.hrp,&local_88.dp);
    _Var1 = std::operator==(&sStack_a8,&local_28);
    if (_Var1) {
      std::__cxx11::string::~string((string *)&local_28);
      bech32::DecodedResult::~DecodedResult(&local_88);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&sStack_a8);
      return;
    }
    __assert_fail("bstr1 == bstr2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                  ,0xd7,"void decode_and_encode_c1_minimalExample_producesSameResult()");
  }
  __assert_fail("bech32::Encoding::Bech32 == decodedResult.encoding",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                ,0xd3,"void decode_and_encode_c1_minimalExample_producesSameResult()");
}

Assistant:

void decode_and_encode_c1_minimalExample_producesSameResult() {
    std::string bstr1 = "a12uel5l";
    std::string expectedHrp = "a";

    bech32::DecodedResult decodedResult = bech32::decode(bstr1);

    assert(expectedHrp == decodedResult.hrp);
    assert(bech32::Encoding::Bech32 == decodedResult.encoding);

    std::string bstr2 = bech32::encodeUsingOriginalConstant(decodedResult.hrp, decodedResult.dp);

    assert(bstr1 == bstr2);
}